

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::optimizeConstantPointer
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this)

{
  address64_t aVar1;
  Literal *pLVar2;
  Literal local_b0;
  Literal local_98;
  undefined4 local_7c;
  uint local_78;
  uint32_t offset_1;
  uint32_t base_1;
  Literal local_68;
  Literal local_50;
  undefined1 local_31;
  unsigned_long uStack_30;
  bool overflow;
  uint64_t max;
  uint64_t offset;
  uint64_t base;
  Const *c;
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this_local;
  
  c = (Const *)this;
  aVar1 = wasm::Address::operator_cast_to_unsigned_long(&this->curr->offset);
  if (aVar1 != 0) {
    base = (uint64_t)Expression::cast<wasm::Const>(this->curr->ptr);
    if ((this->memory64 & 1U) == 0) {
      local_78 = wasm::Literal::geti32(&((Const *)base)->value);
      aVar1 = wasm::Address::operator_cast_to_unsigned_long(&this->curr->offset);
      local_7c = (undefined4)aVar1;
      if ((ulong)local_78 + (aVar1 & 0xffffffff) < 0x100000000) {
        pLVar2 = (Literal *)(base + 0x10);
        aVar1 = wasm::Address::operator_cast_to_unsigned_long(&this->curr->offset);
        wasm::Literal::Literal(&local_b0,(uint32_t)aVar1);
        wasm::Literal::add(&local_98,pLVar2,&local_b0);
        wasm::Literal::operator=((Literal *)(base + 0x10),&local_98);
        wasm::Literal::~Literal(&local_98);
        wasm::Literal::~Literal(&local_b0);
        wasm::Address::operator=(&this->curr->offset,0);
      }
    }
    else {
      offset = wasm::Literal::geti64(&((Const *)base)->value);
      max = wasm::Address::operator_cast_to_unsigned_long(&this->curr->offset);
      uStack_30 = std::numeric_limits<unsigned_long>::max();
      local_31 = uStack_30 - max < offset;
      if (!(bool)local_31) {
        pLVar2 = (Literal *)(base + 0x10);
        wasm::Literal::Literal(&local_68,max);
        wasm::Literal::add(&local_50,pLVar2,&local_68);
        wasm::Literal::operator=((Literal *)(base + 0x10),&local_50);
        wasm::Literal::~Literal(&local_50);
        wasm::Literal::~Literal(&local_68);
        wasm::Address::operator=(&this->curr->offset,0);
      }
    }
  }
  return;
}

Assistant:

void optimizeConstantPointer() {
    // The constant and an offset are interchangeable:
    //   (load (const X))  <=>  (load offset=X (const 0))
    // It may not matter if we do this or not - it's the same size,
    // and in both cases the compiler can see it's a constant location.
    // For code clarity and compressibility, we prefer to put the
    // entire address in the constant.
    if (curr->offset) {
      // Note that the offset may already be larger than low memory - the
      // code may know that is valid, even if we can't. Only handle the
      // obviously valid case where an overflow can't occur.
      auto* c = curr->ptr->template cast<Const>();
      if (memory64) {
        uint64_t base = c->value.geti64();
        uint64_t offset = curr->offset;

        uint64_t max = std::numeric_limits<uint64_t>::max();
        bool overflow = (base > max - offset);
        if (!overflow) {
          c->value = c->value.add(Literal(offset));
          curr->offset = 0;
        }
      } else {
        uint32_t base = c->value.geti32();
        uint32_t offset = curr->offset;
        if (uint64_t(base) + uint64_t(offset) < (uint64_t(1) << 32)) {
          c->value = c->value.add(Literal(uint32_t(curr->offset)));
          curr->offset = 0;
        }
      }
    }
  }